

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall
Console::Prompt::Private::stringToConcharArray
          (Private *this,String *data,Array<unsigned_int> *result)

{
  bool bVar1;
  byte bVar2;
  uint32 *puVar3;
  uint32 uVar4;
  byte *ch;
  usize uVar5;
  uint *puVar6;
  char *end;
  byte *pbVar7;
  char *i;
  usize uVar8;
  
  puVar6 = (result->_begin).item;
  if (puVar6 != (uint *)0x0) {
    (result->_end).item = puVar6;
  }
  Array<unsigned_int>::reserve(result,data->data->len);
  bVar1 = this->utf8;
  ch = (byte *)String::operator_cast_to_char_(data);
  uVar8 = data->data->len;
  pbVar7 = ch + uVar8;
  if (bVar1 == true) {
    if (0 < (long)uVar8) {
      do {
        bVar2 = *ch;
        uVar8 = 1;
        if ((((char)bVar2 < '\0') && (uVar8 = 2, (bVar2 & 0xe0) != 0xc0)) &&
           (uVar8 = 3, (bVar2 & 0xf0) != 0xe0)) {
          uVar8 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
        }
        uVar5 = 1;
        if (uVar8 - 1 < (ulong)((long)pbVar7 - (long)ch)) {
          uVar4 = Unicode::fromString((char *)ch,uVar8);
          Array<unsigned_int>::reserve
                    (result,((long)(result->_end).item - (long)(result->_begin).item >> 2) + 1);
          puVar3 = (result->_end).item;
          *puVar3 = uVar4;
          (result->_end).item = puVar3 + 1;
          uVar5 = uVar8;
        }
        ch = ch + uVar5;
      } while (ch < pbVar7);
    }
  }
  else if (0 < (long)uVar8) {
    puVar6 = (result->_end).item;
    do {
      bVar2 = *ch;
      Array<unsigned_int>::reserve(result,((long)puVar6 - (long)(result->_begin).item >> 2) + 1);
      puVar6 = (result->_end).item;
      *puVar6 = (uint)bVar2;
      puVar6 = puVar6 + 1;
      (result->_end).item = puVar6;
      ch = ch + 1;
    } while (ch < pbVar7);
  }
  return;
}

Assistant:

void stringToConcharArray(const String& data, Array<conchar>& result)
  {
    result.clear();
    result.reserve(data.length());
#ifdef _MSC_VER
    for(const char* i = data, * end = i + data.length(); i < end; ++i)
      result.append(*i);
#else
    if(utf8)
    {
      for(const char* i = data, * end = i + data.length(); i < end;)
      {
        usize len = Unicode::length(*i);
        if(len == 0 || (usize)(end - i) < len)
        {
          ++i;
          continue;
        }
        result.append(Unicode::fromString(i, len));
        i += len;
      }
    }
    else
      for(const char* i = data, * end = i + data.length(); i < end; ++i)
        result.append((const uchar&)*i);
#endif
  }